

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

bool __thiscall stk::FileWrite::setAifFile(FileWrite *this,string *fileName)

{
  StkFormat SVar1;
  long lVar2;
  FILE *pFVar3;
  ulong uVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  char zeroes [2];
  short local_aa;
  unsigned_long rate;
  char type [4];
  AifHeader hdr;
  AifSsnd ssnd;
  string name;
  
  std::__cxx11::string::string((string *)&name,(string *)fileName);
  lVar2 = std::__cxx11::string::find((char *)fileName,0x1113a0);
  if (lVar2 == -1) {
    std::__cxx11::string::append((char *)fileName);
  }
  pFVar3 = fopen((fileName->_M_dataplus)._M_p,"wb");
  this->fd_ = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create AIF file: ");
    std::operator<<(poVar6,(string *)fileName);
  }
  else {
    hdr.sampleSize = 0x10;
    hdr._44_4_ = 0;
    hdr.sampleFrames = 0;
    builtin_strncpy(hdr.form,"FORM",4);
    hdr.formSize = 0x2e;
    builtin_strncpy(hdr.aiff,"AIFF",4);
    builtin_strncpy(hdr.comm,"COMM",4);
    ssnd.blockSize = 0;
    builtin_strncpy(ssnd.ssnd,"SSND",4);
    ssnd.ssndSize = 8;
    ssnd.offset = 0;
    hdr.nChannels = (SINT16)this->channels_;
    hdr.commSize = 0x12;
    hdr._22_2_ = 0;
    SVar1 = this->dataType_;
    if (SVar1 == 1) {
      hdr.sampleSize = 8;
    }
    else if (SVar1 == 2) {
      hdr.sampleSize = 0x10;
    }
    else if (SVar1 == 4) {
      hdr.sampleSize = 0x18;
    }
    else if (SVar1 == 8) {
      hdr.sampleSize = 0x20;
    }
    else {
      if (SVar1 == 0x10) {
        hdr.sampleSize = 0x20;
      }
      else {
        if (SVar1 != 0x20) goto LAB_0010e4de;
        hdr.sampleSize = 0x40;
      }
      builtin_strncpy(hdr.aiff,"AIFC",4);
      builtin_strncpy(hdr.comm,"COMM",4);
      hdr._22_2_ = 0;
      hdr.commSize = 0x18;
    }
LAB_0010e4de:
    hdr.srate[0] = '\0';
    hdr.srate[1] = '\0';
    hdr.srate[2] = '\0';
    hdr.srate[3] = '\0';
    hdr.srate[4] = '\0';
    hdr.srate[5] = '\0';
    hdr.srate[6] = '\0';
    hdr.srate[7] = '\0';
    hdr.srate[8] = '\0';
    hdr.srate[9] = '\0';
    local_aa = 0x3fff;
    rate = (long)(Stk::srate_ - 9.223372036854776e+18) & (long)Stk::srate_ >> 0x3f |
           (long)Stk::srate_;
    for (uVar4 = rate; ((ushort)(local_aa + 0xc001U) < 0x20 && (1 < uVar4)); uVar4 = uVar4 >> 1) {
      local_aa = local_aa + 1;
    }
    Stk::swap16((uchar *)&local_aa);
    hdr.srate[0] = (undefined1)local_aa;
    hdr.srate[1] = local_aa._1_1_;
    local_aa = 0x20;
    for (; (local_aa != 0 && ((rate & 0x80000000) == 0)); rate = rate * 2) {
      local_aa = local_aa + -1;
    }
    Stk::swap32((uchar *)&rate);
    hdr.srate._2_4_ = SUB84(rate,0);
    hdr.srate._6_2_ = SUB82(rate >> 0x20,0);
    hdr.srate._8_2_ = SUB82(rate >> 0x30,0);
    this->byteswap_ = true;
    Stk::swap32((uchar *)&hdr.formSize);
    Stk::swap32((uchar *)&hdr.commSize);
    Stk::swap16((uchar *)&hdr.nChannels);
    Stk::swap16((uchar *)&hdr.sampleSize);
    Stk::swap32((uchar *)&ssnd.ssndSize);
    Stk::swap32((uchar *)&ssnd.offset);
    Stk::swap32((uchar *)&ssnd.blockSize);
    sVar5 = fwrite(&hdr,4,5,(FILE *)this->fd_);
    if (sVar5 == 5) {
      sVar5 = fwrite(&hdr.nChannels,2,1,(FILE *)this->fd_);
      if (sVar5 == 1) {
        sVar5 = fwrite(&hdr.sampleFrames,4,1,(FILE *)this->fd_);
        if (sVar5 == 1) {
          sVar5 = fwrite(&hdr.sampleSize,2,1,(FILE *)this->fd_);
          if (sVar5 == 1) {
            sVar5 = fwrite(hdr.srate,10,1,(FILE *)this->fd_);
            if (sVar5 == 1) {
              if (this->dataType_ == 0x10) {
                builtin_strncpy(type,"fl32",4);
LAB_0010e6a6:
                zeroes[0] = '\0';
                zeroes[1] = '\0';
                sVar5 = fwrite(type,4,1,(FILE *)this->fd_);
                if (sVar5 == 1) {
                  sVar5 = fwrite(zeroes,2,1,(FILE *)this->fd_);
                  if (sVar5 == 1) goto LAB_0010e6db;
                }
              }
              else {
                if (this->dataType_ == 0x20) {
                  builtin_strncpy(type,"fl64",4);
                  goto LAB_0010e6a6;
                }
LAB_0010e6db:
                sVar5 = fwrite(&ssnd,4,4,(FILE *)this->fd_);
                if (sVar5 == 4) {
                  poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                           "FileWrite: creating AIF file: ");
                  std::operator<<(poVar6,(string *)fileName);
                  bVar7 = true;
                  Stk::handleError(&this->super_Stk,STATUS);
                  goto LAB_0010e741;
                }
              }
            }
          }
        }
      }
    }
    poVar6 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not write AIF header for file: ");
    std::operator<<(poVar6,(string *)fileName);
  }
  bVar7 = false;
LAB_0010e741:
  std::__cxx11::string::~string((string *)&name);
  return bVar7;
}

Assistant:

bool FileWrite :: setAifFile( std::string fileName )
{
  std::string name( fileName );
  if ( fileName.find( ".aif" ) == std::string::npos ) fileName += ".aif";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create AIF file: " << fileName;
    return false;
  }

  // Common parts of AIFF/AIFC header.
  struct AifHeader hdr = {{'F','O','R','M'}, 46, {'A','I','F','F'}, {'C','O','M','M'}, 18, 0, 0, 16, "0"};
  struct AifSsnd ssnd = {{'S','S','N','D'}, 8, 0, 0};
  hdr.nChannels = channels_;
  if ( dataType_ == STK_SINT8 )
    hdr.sampleSize = 8;
  else if ( dataType_ == STK_SINT16 )
    hdr.sampleSize = 16;
  else if ( dataType_ == STK_SINT24 )
    hdr.sampleSize = 24;
  else if ( dataType_ == STK_SINT32 )
    hdr.sampleSize = 32;
  else if ( dataType_ == STK_FLOAT32 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 32;
    hdr.commSize = 24;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 64;
    hdr.commSize = 24;
  }

  // For AIFF files, the sample rate is stored in a 10-byte,
  // IEEE Standard 754 floating point number, so we need to
  // convert to that.
  SINT16 i;
  unsigned long exp;
  unsigned long rate = (unsigned long) Stk::sampleRate();
  memset( hdr.srate, 0, 10 );
  exp = rate;
  for ( i=0; i<32; i++ ) {
    exp >>= 1;
    if ( !exp ) break;
  }
  i += 16383;
#ifdef __LITTLE_ENDIAN__
  swap16((unsigned char *)&i);
#endif
  memcpy( hdr.srate, &i, sizeof(SINT16) );

  for ( i=32; i; i-- ) {
    if ( rate & 0x80000000 ) break;
    rate <<= 1;
  }

#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&rate);
#endif
  memcpy( hdr.srate + 2, &rate, sizeof(rate) );

  byteswap_ = false;  
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
  swap32((unsigned char *)&hdr.formSize);
  swap32((unsigned char *)&hdr.commSize);
  swap16((unsigned char *)&hdr.nChannels);
  swap16((unsigned char *)&hdr.sampleSize);
  swap32((unsigned char *)&ssnd.ssndSize);
  swap32((unsigned char *)&ssnd.offset);
  swap32((unsigned char *)&ssnd.blockSize);
#endif

  // The structure boundaries don't allow a single write of 54 bytes.
  if ( fwrite(&hdr, 4, 5, fd_) != 5 ) goto error;
  if ( fwrite(&hdr.nChannels, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleFrames, 4, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleSize, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.srate, 10, 1, fd_) != 1 ) goto error;

  if ( dataType_ == STK_FLOAT32 ) {
    char type[4] = {'f','l','3','2'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    char type[4] = {'f','l','6','4'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  
  if ( fwrite(&ssnd, 4, 4, fd_) != 4 ) goto error;

  oStream_ << "FileWrite: creating AIF file: " << fileName;
  handleError( StkError::STATUS );
  return true;

 error:
  oStream_ << "FileWrite: could not write AIF header for file: " << fileName;
  return false;
}